

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

void buffer_mmap(uint32_t id,uint32_t fd,uint64_t cpu_start,uint64_t len,uint64_t mmap_offset)

{
  mmt_fd_type mVar1;
  cpu_mapping *mapping_00;
  uint8_t *puVar2;
  cpu_mapping *mapping;
  uint64_t mmap_offset_local;
  uint64_t len_local;
  uint64_t cpu_start_local;
  uint32_t fd_local;
  uint32_t id_local;
  
  mapping_00 = (cpu_mapping *)calloc(0x100,1);
  mapping_00->fd = fd;
  mVar1 = demmt_get_fdtype(fd);
  mapping_00->fdtype = mVar1;
  mapping_00->mmap_offset = mmap_offset;
  puVar2 = (uint8_t *)calloc(len,1);
  mapping_00->data = puVar2;
  mapping_00->length = len;
  mapping_00->id = id;
  mapping_00->cpu_addr = cpu_start;
  set_cpu_mapping(id,mapping_00);
  return;
}

Assistant:

void buffer_mmap(uint32_t id, uint32_t fd, uint64_t cpu_start, uint64_t len, uint64_t mmap_offset)
{
	struct cpu_mapping *mapping = calloc(sizeof(struct cpu_mapping), 1);
	mapping->fd = fd;
	mapping->fdtype = demmt_get_fdtype(fd);
	mapping->mmap_offset = mmap_offset;
	mapping->data = calloc(len, 1);
	mapping->length = len;
	mapping->id = id;
	mapping->cpu_addr = cpu_start;

	set_cpu_mapping(id, mapping);
}